

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void __thiscall sliced_chunk_iterator::cleanup(sliced_chunk_iterator *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long lVar2;
  FILE *pFVar3;
  sliced_chunk_iterator *this_local;
  
  lVar1 = this->next;
  lVar2 = std::numeric_limits<long>::max();
  if (lVar1 != lVar2) {
    pFVar3 = (FILE *)comparer_context::get_actual(this->ctx);
    fseek(pFVar3,this->next,0);
    pFVar3 = (FILE *)comparer_context::get_expect(this->ctx);
    fseek(pFVar3,this->next,0);
    comparer_context::pop_length(this->ctx);
  }
  return;
}

Assistant:

void cleanup() {
        if(next != std::numeric_limits<long>::max()) {
            fseek(ctx.get_actual(),next,SEEK_SET);
            fseek(ctx.get_expect(),next,SEEK_SET);

            ctx.pop_length();
        }
    }